

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIPathTracer.cpp
# Opt level: O2

void UI::PathTracerMenuItems(shared_ptr<PathTracerThread> *path_tracer_thread)

{
  element_type *peVar1;
  bool bVar2;
  
  peVar1 = (path_tracer_thread->super___shared_ptr<PathTracerThread,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  bVar2 = ImGui::BeginMenu("Channel",true);
  if (bVar2) {
    bVar2 = ImGui::MenuItem("Color",(char *)0x0,
                            ((peVar1->m_path_tracer_viewer_ptr).
                             super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            )->m_view_type == kColor,true);
    if (bVar2) {
      ((peVar1->m_path_tracer_viewer_ptr).
       super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_view_type =
           kColor;
      PathTracerThread::UpdateViewer
                ((path_tracer_thread->
                 super___shared_ptr<PathTracerThread,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    }
    bVar2 = ImGui::MenuItem("Albedo",(char *)0x0,
                            ((peVar1->m_path_tracer_viewer_ptr).
                             super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            )->m_view_type == kAlbedo,true);
    if (bVar2) {
      ((peVar1->m_path_tracer_viewer_ptr).
       super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_view_type =
           kAlbedo;
      PathTracerThread::UpdateViewer
                ((path_tracer_thread->
                 super___shared_ptr<PathTracerThread,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    }
    bVar2 = ImGui::MenuItem("Normal",(char *)0x0,
                            ((peVar1->m_path_tracer_viewer_ptr).
                             super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            )->m_view_type == kNormal,true);
    if (bVar2) {
      ((peVar1->m_path_tracer_viewer_ptr).
       super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_view_type =
           kNormal;
      PathTracerThread::UpdateViewer
                ((path_tracer_thread->
                 super___shared_ptr<PathTracerThread,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    }
    ImGui::EndMenu();
    return;
  }
  return;
}

Assistant:

void PathTracerMenuItems(const std::shared_ptr<PathTracerThread> &path_tracer_thread) {
	const auto &path_tracer_viewer = path_tracer_thread->GetPathTracerViewerPtr();
	if (ImGui::BeginMenu("Channel")) {
		if (ImGui::MenuItem("Color", nullptr, path_tracer_viewer->m_view_type == PathTracerViewer::ViewTypes::kColor)) {
			path_tracer_viewer->m_view_type = PathTracerViewer::ViewTypes::kColor;
			path_tracer_thread->UpdateViewer();
		}
		if (ImGui::MenuItem("Albedo", nullptr,
		                    path_tracer_viewer->m_view_type == PathTracerViewer::ViewTypes::kAlbedo)) {
			path_tracer_viewer->m_view_type = PathTracerViewer::ViewTypes::kAlbedo;
			path_tracer_thread->UpdateViewer();
		}
		if (ImGui::MenuItem("Normal", nullptr,
		                    path_tracer_viewer->m_view_type == PathTracerViewer::ViewTypes::kNormal)) {
			path_tracer_viewer->m_view_type = PathTracerViewer::ViewTypes::kNormal;
			path_tracer_thread->UpdateViewer();
		}

		ImGui::EndMenu();
	}
}